

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O2

int nsync::nsync_mu_rtrylock(nsync_mu *mu)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = 0;
  LOCK();
  bVar3 = (mu->word).super___atomic_base<unsigned_int>._M_i == 0;
  if (bVar3) {
    (mu->word).super___atomic_base<unsigned_int>._M_i = 0x100;
  }
  UNLOCK();
  if (bVar3) {
    uVar2 = 1;
  }
  else {
    uVar1 = (mu->word).super___atomic_base<unsigned_int>._M_i;
    if ((uVar1 & 0x61) == 0) {
      LOCK();
      bVar3 = uVar1 == (mu->word).super___atomic_base<unsigned_int>._M_i;
      if (bVar3) {
        (mu->word).super___atomic_base<unsigned_int>._M_i = uVar1 + 0x100;
      }
      UNLOCK();
      uVar2 = (uint)bVar3;
    }
  }
  return uVar2;
}

Assistant:

int nsync_mu_rtrylock (nsync_mu *mu) {
	int result;
	IGNORE_RACES_START ();
	if (ATM_CAS_ACQ (&mu->word, 0, MU_RADD_TO_ACQUIRE)) { /* acquire CAS */
		result = 1;
	} else {
		uint32_t old_word = ATM_LOAD (&mu->word);
		result = ((old_word&MU_RZERO_TO_ACQUIRE) == 0 &&
			  ATM_CAS_ACQ (&mu->word, old_word,
				       (old_word+MU_RADD_TO_ACQUIRE) & ~MU_RCLEAR_ON_ACQUIRE));
	}
	IGNORE_RACES_END ();
	RWLOCK_TRYACQUIRE (result, mu, 0);
	return (result);
}